

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O0

void * oonf_class_malloc(oonf_class *ci)

{
  list_entity *plVar1;
  bool bVar2;
  list_entity *plVar3;
  char *pcVar4;
  bool bVar5;
  list_entity *plStack_78;
  _Bool reuse;
  void *ptr;
  list_entity *entity;
  oonf_class *ci_local;
  
  bVar2 = false;
  plVar3 = &ci->_free_list;
  bVar5 = false;
  if (plVar3->next == plVar3) {
    bVar5 = (ci->_free_list).prev == plVar3;
  }
  if (bVar5) {
    plStack_78 = (list_entity *)calloc(1,ci->total_size);
    if (plStack_78 == (list_entity *)0x0) {
      if ((log_global_mask[_oonf_class_subsystem.logging] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0xb4,
                 (void *)0x0,0,"Out of memory for: %s",ci->name);
      }
      return (void *)0x0;
    }
    ci->_allocated = ci->_allocated + 1;
  }
  else {
    plStack_78 = (ci->_free_list).next;
    plVar3 = plStack_78->prev;
    plVar1 = plStack_78->next;
    plVar3->next = plVar1;
    plVar1->prev = plVar3;
    plStack_78->prev = (list_entity *)0x0;
    plStack_78->next = (list_entity *)0x0;
    memset(plStack_78,0,ci->total_size);
    ci->_free_list_size = ci->_free_list_size - 1;
    ci->_recycled = ci->_recycled + 1;
    bVar2 = true;
  }
  ci->_current_usage = ci->_current_usage + 1;
  if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
    pcVar4 = "";
    if (bVar2) {
      pcVar4 = ", reuse";
    }
    oonf_log(LOG_SEVERITY_DEBUG,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0xcf,
             (void *)0x0,0,"MEMORY: alloc %s, %zu bytes%s\n",ci->name,ci->total_size,pcVar4);
  }
  return plStack_78;
}

Assistant:

void *
oonf_class_malloc(struct oonf_class *ci) {
  struct list_entity *entity;
  void *ptr;

#ifdef OONF_LOG_DEBUG_INFO
  bool reuse = false;
#endif

  /*
   * Check first if we have reusable memory.
   */
  if (list_is_empty(&ci->_free_list)) {
    /*
     * No reusable memory block on the free_list.
     * Allocate a fresh one.
     */
    ptr = calloc(1, ci->total_size);
    if (ptr == NULL) {
      OONF_WARN(LOG_CLASS, "Out of memory for: %s", ci->name);
      return NULL;
    }
    ci->_allocated++;
  }
  else {
    /*
     * There is a memory block on the free list.
     * Carve it out of the list, and clean.
     */
    entity = ci->_free_list.next;
    list_remove(entity);

    memset(entity, 0, ci->total_size);
    ptr = entity;

    ci->_free_list_size--;
    ci->_recycled++;
#ifdef OONF_LOG_DEBUG_INFO
    reuse = true;
#endif
  }

  /* Stats keeping */
  ci->_current_usage++;

  OONF_DEBUG(LOG_CLASS, "MEMORY: alloc %s, %" PRINTF_SIZE_T_SPECIFIER " bytes%s\n", ci->name, ci->total_size,
    reuse ? ", reuse" : "");
  return ptr;
}